

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  bool *this_00;
  FILE *__stream;
  int iVar1;
  reference pvVar2;
  undefined8 uVar3;
  reference pvVar4;
  reference ppLVar5;
  long *in_RSI;
  long *in_RDI;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_3;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  char blob_name [256];
  Blob *blob_2;
  int j_1;
  Blob *blob;
  Blob *blob_1;
  int bottom_blob_index;
  char bottom_name [256];
  int j;
  Layer *layer;
  int top_count;
  int bottom_count;
  char layer_name [256];
  char layer_type [256];
  int i;
  int blob_index;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  char *in_stack_fffffffffffff858;
  Mat *in_stack_fffffffffffff860;
  Layer *in_stack_fffffffffffff868;
  FILE *in_stack_fffffffffffff870;
  uint in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  Mat *in_stack_fffffffffffff880;
  ParamDict *in_stack_fffffffffffff888;
  NetPrivate *in_stack_fffffffffffff890;
  Mat *in_stack_fffffffffffff898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  undefined7 in_stack_fffffffffffff8b0;
  undefined1 in_stack_fffffffffffff8b7;
  undefined4 in_stack_fffffffffffff8c0;
  uint in_stack_fffffffffffff8c4;
  int in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  Net *in_stack_fffffffffffff8f0;
  int local_6c0;
  int local_6bc;
  Mat local_670;
  Mat local_628;
  int local_5dc;
  reference local_5d8;
  int local_5cc;
  int *local_5c8;
  Mat local_5c0;
  Mat local_578;
  int local_530;
  allocator<char> local_529;
  string local_528 [32];
  undefined1 local_508 [256];
  reference local_408;
  int local_3fc;
  reference local_3f8;
  allocator<char> local_3e9;
  string local_3e8 [32];
  reference local_3c8;
  int local_3bc;
  undefined1 local_3b8 [256];
  int local_2b8;
  allocator<char> local_2b1;
  Net local_2b0;
  undefined4 local_260;
  int local_250;
  int local_24c;
  undefined1 local_248 [256];
  undefined1 local_148 [264];
  uint local_40;
  int local_3c;
  undefined1 local_38 [20];
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  iVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d",&local_1c);
  if (iVar1 == 1) {
    if (local_1c == 0x7685dd) {
      local_20 = 0;
      local_24 = 0;
      iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_20);
      if (iVar1 == 1) {
        iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_24);
        if (iVar1 == 1) {
          if ((local_20 < 1) || (local_24 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_4 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_fffffffffffff880,
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffff880,
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
            ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff880);
            local_3c = 0;
            for (local_40 = 0; (int)local_40 < local_20; local_40 = local_40 + 1) {
              local_24c = 0;
              local_250 = 0;
              iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_148);
              if (iVar1 != 1) {
                fprintf(_stderr,"parse layer_type failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_001887b6;
              }
              iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_248);
              if (iVar1 != 1) {
                fprintf(_stderr,"parse layer_name failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_001887b6;
              }
              iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_24c);
              if (iVar1 != 1) {
                fprintf(_stderr,"parse bottom_count failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_001887b6;
              }
              iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_250);
              if (iVar1 != 1) {
                fprintf(_stderr,"parse top_count failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_001887b6;
              }
              local_2b0.d = (NetPrivate *)create_layer(in_stack_fffffffffffff858);
              if ((Layer *)local_2b0.d == (Layer *)0x0) {
                local_2b0.d = (NetPrivate *)(**(code **)(*in_RDI + 0x18))(in_RDI,local_148);
              }
              if ((Layer *)local_2b0.d == (Layer *)0x0) {
                fprintf(_stderr,"layer %s not exists or registered",local_148);
                fprintf(_stderr,"\n");
                clear(in_stack_fffffffffffff8f0);
                local_4 = -1;
                goto LAB_001887b6;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                         (allocator<char> *)in_stack_fffffffffffff890);
              this_00 = &local_2b0.opt.use_bf16_storage;
              std::__cxx11::string::operator=
                        ((string *)((long)local_2b0.d + 0x30),(string *)this_00);
              std::__cxx11::string::~string((string *)this_00);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b0.opt.use_vulkan_compute)
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                         (allocator<char> *)in_stack_fffffffffffff890);
              in_stack_fffffffffffff8f0 = &local_2b0;
              std::__cxx11::string::operator=
                        ((string *)&(local_2b0.d)->output_blob_indexes,
                         (string *)in_stack_fffffffffffff8f0);
              std::__cxx11::string::~string((string *)in_stack_fffffffffffff8f0);
              std::allocator<char>::~allocator(&local_2b1);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              for (local_2b8 = 0; local_2b8 < local_24c; local_2b8 = local_2b8 + 1) {
                iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_3b8);
                if (iVar1 != 1) {
                  fprintf(_stderr,"parse bottom_name failed");
                  fprintf(_stderr,"\n");
                  local_4 = -1;
                  goto LAB_001887b6;
                }
                local_3bc = find_blob_index_by_name
                                      ((Net *)CONCAT44(in_stack_fffffffffffff87c,
                                                       in_stack_fffffffffffff878),
                                       (char *)in_stack_fffffffffffff870);
                if (local_3bc == -1) {
                  local_3c8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         (in_RDI[9] + 8),(long)local_3c);
                  local_3bc = local_3c;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                             (allocator<char> *)in_stack_fffffffffffff890);
                  std::__cxx11::string::operator=((string *)local_3c8,local_3e8);
                  std::__cxx11::string::~string(local_3e8);
                  std::allocator<char>::~allocator(&local_3e9);
                  local_3c = local_3c + 1;
                }
                local_3f8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_3bc);
                iVar1 = local_3bc;
                local_3f8->consumer = local_40;
                pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)((long)local_2b0.d + 0x70),
                                    (long)local_2b8);
                *pvVar2 = iVar1;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880,
                         CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
              for (local_3fc = 0; local_3fc < local_250; local_3fc = local_3fc + 1) {
                local_408 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI[9] + 8),(long)local_3c);
                iVar1 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_508);
                if (iVar1 != 1) {
                  fprintf(_stderr,"parse blob_name failed");
                  fprintf(_stderr,"\n");
                  local_4 = -1;
                  goto LAB_001887b6;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                           (allocator<char> *)in_stack_fffffffffffff890);
                std::__cxx11::string::operator=((string *)local_408,local_528);
                std::__cxx11::string::~string(local_528);
                std::allocator<char>::~allocator(&local_529);
                local_408->producer = local_40;
                in_stack_fffffffffffff8cc = local_3c;
                pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)((long)local_2b0.d + 0x88),
                                    (long)local_3fc);
                *pvVar2 = in_stack_fffffffffffff8cc;
                local_3c = local_3c + 1;
              }
              in_stack_fffffffffffff8c8 =
                   ParamDict::load_param
                             ((ParamDict *)
                              CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8),
                              (DataReader *)
                              CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
              __stream = _stderr;
              local_530 = in_stack_fffffffffffff8c8;
              if (in_stack_fffffffffffff8c8 == 0) {
                if ((*(bool *)((long)local_2b0.d + 0xe) & 1U) != 0) {
                  *(undefined1 *)((long)in_RDI + 0x27) = 0;
                }
                ncnn::Mat::Mat(&local_5c0);
                ParamDict::get(in_stack_fffffffffffff888,
                               (int)((ulong)in_stack_fffffffffffff880 >> 0x20),
                               (Mat *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878))
                ;
                ncnn::Mat::~Mat((Mat *)0x1881f0);
                in_stack_fffffffffffff8b7 = ncnn::Mat::empty(in_stack_fffffffffffff860);
                if (!(bool)in_stack_fffffffffffff8b7) {
                  local_5c8 = ncnn::Mat::operator_cast_to_int_(&local_578);
                  for (local_5cc = 0; local_5cc < local_250; local_5cc = local_5cc + 1) {
                    in_stack_fffffffffffff8a0 =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (in_RDI[9] + 8);
                    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                       ((vector<int,_std::allocator<int>_> *)
                                        ((long)local_2b0.d + 0x88),(long)local_5cc);
                    local_5d8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                          ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                           in_stack_fffffffffffff8a0,(long)*pvVar2);
                    local_5dc = *local_5c8;
                    if (local_5dc == 1) {
                      ncnn::Mat::Mat(&local_628,local_5c8[1],(void *)0x0,4,1,(Allocator *)0x0);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_fffffffffffff868,in_stack_fffffffffffff860);
                      ncnn::Mat::~Mat((Mat *)0x18830b);
                    }
                    if (local_5dc == 2) {
                      in_stack_fffffffffffff858 = (char *)0x0;
                      ncnn::Mat::Mat(&local_670,local_5c8[1],local_5c8[2],(void *)0x0,4,1,
                                     (Allocator *)0x0);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_fffffffffffff868,in_stack_fffffffffffff860);
                      ncnn::Mat::~Mat((Mat *)0x1883df);
                    }
                    if (local_5dc == 3) {
                      in_stack_fffffffffffff860 = (Mat *)0x0;
                      in_stack_fffffffffffff858 =
                           (char *)CONCAT44((int)((ulong)in_stack_fffffffffffff858 >> 0x20),1);
                      ncnn::Mat::Mat(in_stack_fffffffffffff880,in_stack_fffffffffffff87c,
                                     in_stack_fffffffffffff878,
                                     (int)((ulong)in_stack_fffffffffffff870 >> 0x20),
                                     in_stack_fffffffffffff868,0,(int)in_stack_fffffffffffff890,
                                     (Allocator *)in_stack_fffffffffffff898);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_fffffffffffff868,in_stack_fffffffffffff860);
                      ncnn::Mat::~Mat((Mat *)0x188479);
                    }
                    local_5c8 = local_5c8 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff880,
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                for (local_6bc = 0; local_6bc < local_24c; local_6bc = local_6bc + 1) {
                  in_stack_fffffffffffff890 = (NetPrivate *)(in_RDI[9] + 8);
                  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)
                                      ((long)local_2b0.d + 0x70),(long)local_6bc);
                  pvVar4 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffff890,(long)*pvVar2);
                  in_stack_fffffffffffff898 = &pvVar4->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                             ((long)local_2b0.d + 0xa0),(long)local_6bc);
                  ncnn::Mat::operator=((Mat *)in_stack_fffffffffffff868,in_stack_fffffffffffff860);
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_fffffffffffff880,
                           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
                for (local_6c0 = 0; local_6c0 < local_250; local_6c0 = local_6c0 + 1) {
                  in_stack_fffffffffffff880 = (Mat *)(in_RDI[9] + 8);
                  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)
                                      ((long)local_2b0.d + 0x88),(long)local_6c0);
                  pvVar4 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_fffffffffffff880,(long)*pvVar2);
                  in_stack_fffffffffffff888 = (ParamDict *)&pvVar4->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                             &(local_2b0.d)->local_workspace_allocator,(long)local_6c0);
                  ncnn::Mat::operator=((Mat *)in_stack_fffffffffffff868,in_stack_fffffffffffff860);
                }
                in_stack_fffffffffffff87c =
                     (**(_func_int **)((long)(local_2b0.d)->opt + 0x10))(local_2b0.d,local_38);
                if (in_stack_fffffffffffff87c == 0) {
                  in_stack_fffffffffffff868 = (Layer *)local_2b0.d;
                  ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                       (in_RDI[9] + 0x20),(long)(int)local_40);
                  *ppLVar5 = in_stack_fffffffffffff868;
                  local_260 = 0;
                }
                else {
                  in_stack_fffffffffffff870 = _stderr;
                  in_stack_fffffffffffff878 = local_40;
                  uVar3 = std::__cxx11::string::c_str();
                  fprintf(in_stack_fffffffffffff870,"layer load_param %d %s failed",
                          (ulong)in_stack_fffffffffffff878,uVar3);
                  fprintf(_stderr,"\n");
                  local_260 = 0xe;
                }
                ncnn::Mat::~Mat((Mat *)0x188744);
              }
              else {
                in_stack_fffffffffffff8c4 = local_40;
                uVar3 = std::__cxx11::string::c_str();
                fprintf(__stream,"ParamDict load_param %d %s failed",
                        (ulong)in_stack_fffffffffffff8c4,uVar3);
                fprintf(_stderr,"\n");
              }
            }
            NetPrivate::update_input_output_indexes(in_stack_fffffffffffff890);
            NetPrivate::update_input_output_names
                      ((NetPrivate *)CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0));
            local_4 = 0;
LAB_001887b6:
            local_260 = 1;
            ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffff860);
          }
        }
        else {
          fprintf(_stderr,"parse blob_count failed");
          fprintf(_stderr,"\n");
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"parse layer_count failed");
        fprintf(_stderr,"\n");
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"parse magic failed");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}